

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t read_zip64_eocd(archive_read *a,zip *zip,char *p)

{
  uint32_t uVar1;
  int64_t iVar2;
  void *pvVar3;
  uint64_t uVar4;
  archive_read *a_00;
  uint64_t uVar5;
  long in_RDX;
  long in_RSI;
  int64_t eocd64_size;
  int64_t eocd64_offset;
  size_t in_stack_ffffffffffffffc8;
  archive_read *in_stack_ffffffffffffffd0;
  undefined4 local_4;
  
  uVar1 = archive_le32dec((void *)(in_RDX + 4));
  if (uVar1 == 0) {
    uVar1 = archive_le32dec((void *)(in_RDX + 0x10));
    if (uVar1 == 1) {
      archive_le64dec(in_stack_ffffffffffffffd0);
      iVar2 = __archive_read_seek(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
      if (iVar2 < 0) {
        local_4 = L'\0';
      }
      else {
        pvVar3 = __archive_read_ahead
                           (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(ssize_t *)0x27ab4d)
        ;
        if (pvVar3 == (void *)0x0) {
          local_4 = L'\0';
        }
        else {
          uVar4 = archive_le64dec(in_stack_ffffffffffffffd0);
          a_00 = (archive_read *)(uVar4 + 0xc);
          if (((long)a_00 < 0x38) || (0x4000 < (long)a_00)) {
            local_4 = L'\0';
          }
          else {
            pvVar3 = __archive_read_ahead(a_00,in_stack_ffffffffffffffc8,(ssize_t *)0x27abaf);
            if (pvVar3 == (void *)0x0) {
              local_4 = L'\0';
            }
            else {
              uVar1 = archive_le32dec((void *)((long)pvVar3 + 0x10));
              if (uVar1 == 0) {
                uVar1 = archive_le32dec((void *)((long)pvVar3 + 0x14));
                if (uVar1 == 0) {
                  uVar4 = archive_le64dec(a_00);
                  uVar5 = archive_le64dec(a_00);
                  if (uVar4 == uVar5) {
                    uVar4 = archive_le64dec(a_00);
                    *(uint64_t *)(in_RSI + 0x40) = uVar4;
                    local_4 = L' ';
                  }
                  else {
                    local_4 = L'\0';
                  }
                }
                else {
                  local_4 = L'\0';
                }
              }
              else {
                local_4 = L'\0';
              }
            }
          }
        }
      }
    }
    else {
      local_4 = L'\0';
    }
  }
  else {
    local_4 = L'\0';
  }
  return local_4;
}

Assistant:

static int
read_zip64_eocd(struct archive_read *a, struct zip *zip, const char *p)
{
	int64_t eocd64_offset;
	int64_t eocd64_size;

	/* Sanity-check the locator record. */

	/* Central dir must be on first volume. */
	if (archive_le32dec(p + 4) != 0)
		return 0;
	/* Must be only a single volume. */
	if (archive_le32dec(p + 16) != 1)
		return 0;

	/* Find the Zip64 EOCD record. */
	eocd64_offset = archive_le64dec(p + 8);
	if (__archive_read_seek(a, eocd64_offset, SEEK_SET) < 0)
		return 0;
	if ((p = __archive_read_ahead(a, 56, NULL)) == NULL)
		return 0;
	/* Make sure we can read all of it. */
	eocd64_size = archive_le64dec(p + 4) + 12;
	if (eocd64_size < 56 || eocd64_size > 16384)
		return 0;
	if ((p = __archive_read_ahead(a, eocd64_size, NULL)) == NULL)
		return 0;

	/* Sanity-check the EOCD64 */
	if (archive_le32dec(p + 16) != 0) /* Must be disk #0 */
		return 0;
	if (archive_le32dec(p + 20) != 0) /* CD must be on disk #0 */
		return 0;
	/* CD can't be split. */
	if (archive_le64dec(p + 24) != archive_le64dec(p + 32))
		return 0;

	/* Save the central directory offset for later use. */
	zip->central_directory_offset = archive_le64dec(p + 48);

	return 32;
}